

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlnumber.c
# Opt level: O1

err_t RenderDataFloat(ebml_float *Element,stream *Output,bool_t bForceWithoutMandatory,
                     bool_t bWithDefault,int ForProfile,filepos_t *Rendered)

{
  double dVar1;
  err_t eVar2;
  undefined8 uVar3;
  void *pvVar4;
  float fVar5;
  uint64_t Buf;
  size_t i;
  ulong local_18;
  filepos_t local_10;
  
  local_10 = 0;
  if ((Element->Base).DataSize == 8) {
    dVar1 = Element->Value;
    local_18 = (ulong)dVar1 >> 0x38 | ((ulong)dVar1 & 0xff000000000000) >> 0x28 |
               ((ulong)dVar1 & 0xff0000000000) >> 0x18 | ((ulong)dVar1 & 0xff00000000) >> 8 |
               ((ulong)dVar1 & 0xff000000) << 8 | ((ulong)dVar1 & 0xff0000) << 0x18 |
               ((ulong)dVar1 & 0xff00) << 0x28 | (long)dVar1 << 0x38;
    if (Output == (stream *)0x0) {
      __assert_fail("(const void*)(Output)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                    ,0xb0,
                    "err_t RenderDataFloat(ebml_float *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                   );
    }
    pvVar4 = (Output->Base).VMT;
    uVar3 = 8;
  }
  else {
    fVar5 = (float)Element->Value;
    local_18 = CONCAT44(local_18._4_4_,
                        (uint)fVar5 >> 0x18 | ((uint)fVar5 & 0xff0000) >> 8 |
                        ((uint)fVar5 & 0xff00) << 8 | (int)fVar5 << 0x18);
    if (Output == (stream *)0x0) {
      __assert_fail("(const void*)(Output)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                    ,0xbb,
                    "err_t RenderDataFloat(ebml_float *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                   );
    }
    pvVar4 = (Output->Base).VMT;
    uVar3 = 4;
  }
  eVar2 = (**(code **)((long)pvVar4 + 0x70))(Output,&local_18,uVar3,&local_10);
  if (Rendered != (filepos_t *)0x0) {
    *Rendered = local_10;
  }
  return eVar2;
}

Assistant:

static err_t RenderDataFloat(ebml_float *Element, struct stream *Output, bool_t UNUSED_PARAM(bForceWithoutMandatory), bool_t UNUSED_PARAM(bWithDefault), int UNUSED_PARAM(ForProfile), filepos_t *Rendered)
{
    err_t Err;
    size_t i = 0;
    if (Element->Base.DataSize == 8)
    {
        union {
            uint32_t i;
            double f;
        } data;
        uint64_t Buf;
        data.f = Element->Value;
        Buf = LOAD64BE(&data.i);
        Err = Stream_Write(Output,&Buf,8,&i);
    }
    else
    {
        union {
            uint32_t i;
            float f;
        } data;
        uint32_t Buf;
        data.f = (float)Element->Value;
        Buf = LOAD32BE(&data.i);
        Err = Stream_Write(Output,&Buf,4,&i);
    }
    if (Rendered)
        *Rendered = i;
    return Err;
}